

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densematrix.cc
# Opt level: O2

void __thiscall fasttext::DenseMatrix::uniform(DenseMatrix *this,real a,uint thread,int32_t seed)

{
  int32_t i;
  ulong uVar1;
  uint uVar2;
  long *local_60;
  real local_54;
  thread local_50;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  
  if (1 < thread) {
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._0_12_ = ZEXT412(0);
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_finish._4_4_ = 0;
    threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_54 = a;
    for (uVar2 = 0; thread != uVar2; uVar2 = uVar2 + 1) {
      local_50._M_id._M_thread = (id)0;
      local_60 = (long *)operator_new(0x20);
      *local_60 = (long)&PTR___State_0015bc00;
      local_60[1] = (long)this;
      *(real *)(local_60 + 2) = local_54;
      *(uint *)((long)local_60 + 0x14) = uVar2;
      *(int32_t *)(local_60 + 3) = seed;
      std::thread::_M_start_thread(&local_50,&local_60,0);
      if (local_60 != (long *)0x0) {
        (**(code **)(*local_60 + 8))();
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                (&threads,&local_50);
      std::thread::~thread(&local_50);
    }
    for (uVar1 = 0;
        uVar1 < (ulong)((long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)threads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
      std::thread::join();
    }
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&threads);
    return;
  }
  uniformThread(this,a,0,seed);
  return;
}

Assistant:

void DenseMatrix::uniform(real a, unsigned int thread, int32_t seed) {
  if (thread > 1) {
    std::vector<std::thread> threads;
    for (int i = 0; i < thread; i++) {
      threads.push_back(std::thread([=]() { uniformThread(a, i, seed); }));
    }
    for (int32_t i = 0; i < threads.size(); i++) {
      threads[i].join();
    }
  } else {
    // webassembly can't instantiate `std::thread`
    uniformThread(a, 0, seed);
  }
}